

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O1

void api_suite::api_clear(void)

{
  long local_78;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 *apuStack_60 [4];
  undefined8 **local_40;
  undefined8 **local_38;
  
  local_40 = apuStack_60 + 3;
  apuStack_60[0] = (undefined8 *)0x0;
  apuStack_60[1] = (undefined8 *)0x0;
  apuStack_60[2] = (undefined8 *)0x0;
  apuStack_60[3] = &local_68;
  local_38 = apuStack_60;
  local_68 = 0x10000000b;
  local_78 = (long)local_38 - (long)apuStack_60[3] >> 3;
  uStack_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x49,"void api_suite::api_clear()",&local_78,&uStack_6c);
  local_38 = (undefined8 **)apuStack_60[3];
  local_78 = 0;
  uStack_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x4b,"void api_suite::api_clear()",&local_78,&uStack_6c);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}